

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngdec.c
# Opt level: O1

int ExtractMetadataFromPNG
              (png_structp png,png_infop head_info,png_infop end_info,Metadata *metadata)

{
  char *__s1;
  int *piVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  png_infop ppVar8;
  anon_struct_24_3_f6017608 *paVar9;
  png_textp text;
  png_uint_32 len;
  png_uint_32 len_1;
  png_bytep exif;
  int comp_type;
  int *local_90;
  uint local_88;
  undefined4 uStack_84;
  uint local_7c;
  Metadata *local_78;
  char *local_70;
  MetadataPayload *local_68;
  png_structp local_60;
  png_infop local_58;
  png_infop local_50;
  ulong local_48;
  png_infop local_40;
  undefined1 local_34 [4];
  
  local_68 = &metadata->iccp;
  uVar7 = 0;
  local_78 = metadata;
  local_60 = png;
  local_58 = head_info;
  local_50 = end_info;
  do {
    ppVar8 = local_50;
    if ((int)uVar7 == 0) {
      ppVar8 = local_58;
    }
    local_90 = (int *)0x0;
    iVar3 = png_get_text(png,ppVar8,&local_90,0);
    local_40 = ppVar8;
    iVar4 = png_get_eXIf_1(png,ppVar8,&local_88);
    if ((iVar4 == 0x10000) &&
       (iVar4 = MetadataCopy(local_70,(ulong)local_88,&local_78->exif), iVar4 == 0)) {
      return 0;
    }
    local_48 = uVar7;
    if (iVar3 != 0) {
      iVar4 = 0;
      do {
        piVar1 = local_90;
        __s1 = *(char **)(local_90 + 2);
        iVar5 = strcmp(__s1,"Raw profile type exif");
        paVar9 = kPNGMetadataMap;
        if (iVar5 != 0) {
          lVar2 = 0;
          do {
            lVar6 = lVar2;
            if (lVar6 + 0x18 == 0x78) goto LAB_001058cd;
            iVar5 = strcmp(__s1,*(char **)((long)&kPNGMetadataMap[1].name + lVar6));
            lVar2 = lVar6 + 0x18;
          } while (iVar5 != 0);
          paVar9 = (anon_struct_24_3_f6017608 *)(lVar6 + 0x1fbb88);
        }
        if (*(long *)((long)&(local_78->exif).bytes + paVar9->storage_offset) == 0) {
          iVar5 = (*paVar9->process)(*(char **)(piVar1 + 4),
                                     *(size_t *)(piVar1 + (ulong)(*piVar1 - 1U < 2) * 2 + 6),
                                     (MetadataPayload *)
                                     ((long)&(local_78->exif).bytes + paVar9->storage_offset));
          if (iVar5 == 0) {
            ExtractMetadataFromPNG_cold_1();
            return 0;
          }
        }
        else {
          fprintf(stderr,"Ignoring additional \'%s\'\n",__s1);
        }
LAB_001058cd:
        iVar4 = iVar4 + 1;
        local_90 = local_90 + 0xe;
      } while (iVar4 != iVar3);
    }
    png = local_60;
    iVar3 = png_get_iCCP(local_60,local_40,&local_70,local_34,&local_88,&local_7c);
    if ((iVar3 == 0x1000) &&
       (iVar3 = MetadataCopy((char *)CONCAT44(uStack_84,local_88),(ulong)local_7c,local_68),
       iVar3 == 0)) {
      return 0;
    }
    uVar7 = (ulong)((int)local_48 + 1);
    if ((int)local_48 != 0) {
      return 1;
    }
  } while( true );
}

Assistant:

static int ExtractMetadataFromPNG(png_structp png,
                                  png_infop const head_info,
                                  png_infop const end_info,
                                  Metadata* const metadata) {
  int p;

  for (p = 0; p < 2; ++p)  {
    png_infop const info = (p == 0) ? head_info : end_info;
    png_textp text = NULL;
    const png_uint_32 num = png_get_text(png, info, &text, NULL);
    png_uint_32 i;

#ifdef PNG_eXIf_SUPPORTED
    // Look for an 'eXIf' tag. Preference is given to this tag as it's newer
    // than the TextualData tags.
    {
      png_bytep exif;
      png_uint_32 len;

      if (png_get_eXIf_1(png, info, &len, &exif) == PNG_INFO_eXIf) {
        if (!MetadataCopy((const char*)exif, len, &metadata->exif)) return 0;
      }
    }
#endif  // PNG_eXIf_SUPPORTED

    // Look for EXIF / XMP metadata.
    for (i = 0; i < num; ++i, ++text) {
      int j;
      for (j = 0; kPNGMetadataMap[j].name != NULL; ++j) {
        if (!strcmp(text->key, kPNGMetadataMap[j].name)) {
          MetadataPayload* const payload =
              (MetadataPayload*)((uint8_t*)metadata +
                                 kPNGMetadataMap[j].storage_offset);
          png_size_t text_length;
          switch (text->compression) {
#ifdef PNG_iTXt_SUPPORTED
            case PNG_ITXT_COMPRESSION_NONE:
            case PNG_ITXT_COMPRESSION_zTXt:
              text_length = text->itxt_length;
              break;
#endif
            case PNG_TEXT_COMPRESSION_NONE:
            case PNG_TEXT_COMPRESSION_zTXt:
            default:
              text_length = text->text_length;
              break;
          }
          if (payload->bytes != NULL) {
            fprintf(stderr, "Ignoring additional '%s'\n", text->key);
          } else if (!kPNGMetadataMap[j].process(text->text, text_length,
                                                 payload)) {
            fprintf(stderr, "Failed to process: '%s'\n", text->key);
            return 0;
          }
          break;
        }
      }
    }
#ifdef PNG_iCCP_SUPPORTED
    // Look for an ICC profile.
    {
      png_charp name;
      int comp_type;
#if LOCAL_PNG_PREREQ(1,5)
      png_bytep profile;
#else
      png_charp profile;
#endif
      png_uint_32 len;

      if (png_get_iCCP(png, info,
                       &name, &comp_type, &profile, &len) == PNG_INFO_iCCP) {
        if (!MetadataCopy((const char*)profile, len, &metadata->iccp)) return 0;
      }
    }
#endif  // PNG_iCCP_SUPPORTED
  }
  return 1;
}